

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToChar2SetAndContinueInst::Exec
          (SyncToChar2SetAndContinueInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Char CVar1;
  Char CVar2;
  bool bVar3;
  Char matchC1;
  Char matchC0;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToChar2SetAndContinueInst *this_local;
  
  CVar1 = (this->super_Char2Mixin).cs[0];
  CVar2 = (this->super_Char2Mixin).cs[1];
  Matcher::CompStats(matcher);
  while( true ) {
    bVar3 = false;
    if ((*inputOffset < inputLength) && (bVar3 = false, input[*inputOffset] != CVar1)) {
      bVar3 = input[*inputOffset] != CVar2;
    }
    if (!bVar3) break;
    Matcher::CompStats(matcher);
    *inputOffset = *inputOffset + 1;
  }
  *matchStart = *inputOffset;
  *instPointer = *instPointer + 5;
  return false;
}

Assistant:

inline bool SyncToChar2SetAndContinueInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const Char matchC0 = cs[0];
        const Char matchC1 = cs[1];
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputLength && input[inputOffset] != matchC0 && input[inputOffset] != matchC1)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }